

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O1

void google::protobuf::compiler::java::WriteFieldDocComment(Printer *printer,FieldDescriptor *field)

{
  string local_78;
  string local_58;
  string local_38;
  
  io::Printer::Print<>(printer,"/**\n");
  WriteDocCommentBody<google::protobuf::FieldDescriptor>(printer,field);
  FieldDescriptor::DebugString_abi_cxx11_(&local_38,field);
  FirstLineOf(&local_78,&local_38);
  EscapeJavadoc(&local_58,&local_78);
  io::Printer::Print<char[4],std::__cxx11::string>
            (printer," * <code>$def$</code>\n",(char (*) [4])0x3ebae1,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  io::Printer::Print<>(printer," */\n");
  return;
}

Assistant:

void WriteFieldDocComment(io::Printer* printer, const FieldDescriptor* field) {
  // We start the comment with the main body based on the comments from the
  // .proto file (if present). We then continue with the field declaration,
  // e.g.:
  //   optional string foo = 5;
  // And then we end with the javadoc tags if applicable.
  // If the field is a group, the debug string might end with {.
  printer->Print("/**\n");
  WriteDocCommentBody(printer, field);
  printer->Print(" * <code>$def$</code>\n", "def",
                 EscapeJavadoc(FirstLineOf(field->DebugString())));
  printer->Print(" */\n");
}